

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

Error __thiscall
asmjit::StringBuilder::_opNumber
          (StringBuilder *this,uint32_t op,uint64_t i,uint32_t base,size_t width,uint32_t flags)

{
  ulong uVar1;
  char *__n;
  char *pcVar2;
  uint in_ECX;
  char *pcVar3;
  size_t in_RDX;
  char *pcVar4;
  char *in_R8;
  uint in_R9D;
  char *data;
  size_t prefixLength;
  size_t numberLength;
  uint64_t r;
  uint64_t d;
  char sign;
  uint64_t orig;
  char *p;
  char buf [128];
  char local_c9;
  StringBuilder *in_stack_ffffffffffffff48;
  char local_3a [10];
  char *local_30;
  uint local_24;
  ulong local_20;
  uint local_8;
  
  if ((in_ECX < 2) || (local_24 = in_ECX, 0x24 < in_ECX)) {
    local_24 = 10;
  }
  pcVar4 = local_3a + 2;
  local_c9 = '\0';
  if (((in_R9D & 0x80000000) == 0) || (-1 < (long)in_RDX)) {
    if ((in_R9D & 1) == 0) {
      local_20 = in_RDX;
      if ((in_R9D & 2) != 0) {
        local_c9 = ' ';
      }
    }
    else {
      local_c9 = '+';
      local_20 = in_RDX;
    }
  }
  else {
    local_20 = -in_RDX;
    local_c9 = '-';
  }
  do {
    pcVar2 = pcVar4;
    uVar1 = local_20 / local_24;
    pcVar4 = pcVar2 + -1;
    pcVar2[-1] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[local_20 % (ulong)local_24];
    local_20 = uVar1;
  } while (uVar1 != 0);
  __n = local_3a + (2 - (long)pcVar4);
  pcVar3 = pcVar4;
  local_30 = in_R8;
  if ((in_R9D & 4) != 0) {
    if ((local_24 == 8) && (in_RDX != 0)) {
      pcVar4 = pcVar2 + -2;
      pcVar2[-2] = '0';
    }
    pcVar3 = pcVar4;
    if (local_24 == 0x10) {
      pcVar4[-1] = 'x';
      pcVar3 = pcVar4 + -2;
      pcVar4[-2] = '0';
    }
  }
  pcVar4 = pcVar3;
  if (local_c9 != '\0') {
    pcVar4 = pcVar3 + -1;
    pcVar3[-1] = local_c9;
  }
  if ((char *)0x100 < local_30) {
    local_30 = (char *)0x100;
  }
  if (__n < local_30) {
    local_30 = (char *)((long)local_30 - (long)__n);
  }
  else {
    local_30 = (char *)0x0;
  }
  pcVar2 = local_3a + (-(long)__n - (long)pcVar4) + 2;
  pcVar3 = prepare(in_stack_ffffffffffffff48,(uint32_t)((ulong)pcVar4 >> 0x20),in_RDX);
  if (pcVar3 != (char *)0x0) {
    memcpy(pcVar3,pcVar4,(size_t)pcVar2);
    memset(pcVar3 + (long)pcVar2,0x30,(size_t)local_30);
    memcpy(pcVar3 + (long)pcVar2 + (long)local_30,pcVar4 + (long)pcVar2,(size_t)__n);
  }
  local_8 = (uint)(pcVar3 == (char *)0x0);
  return local_8;
}

Assistant:

Error StringBuilder::_opNumber(uint32_t op, uint64_t i, uint32_t base, size_t width, uint32_t flags) noexcept {
  if (base < 2 || base > 36)
    base = 10;

  char buf[128];
  char* p = buf + ASMJIT_ARRAY_SIZE(buf);

  uint64_t orig = i;
  char sign = '\0';

  // --------------------------------------------------------------------------
  // [Sign]
  // --------------------------------------------------------------------------

  if ((flags & kStringFormatSigned) != 0 && static_cast<int64_t>(i) < 0) {
    i = static_cast<uint64_t>(-static_cast<int64_t>(i));
    sign = '-';
  }
  else if ((flags & kStringFormatShowSign) != 0) {
    sign = '+';
  }
  else if ((flags & kStringFormatShowSpace) != 0) {
    sign = ' ';
  }

  // --------------------------------------------------------------------------
  // [Number]
  // --------------------------------------------------------------------------

  do {
    uint64_t d = i / base;
    uint64_t r = i % base;

    *--p = StringBuilder_numbers[r];
    i = d;
  } while (i);

  size_t numberLength = (size_t)(buf + ASMJIT_ARRAY_SIZE(buf) - p);

  // --------------------------------------------------------------------------
  // [Alternate Form]
  // --------------------------------------------------------------------------

  if ((flags & kStringFormatAlternate) != 0) {
    if (base == 8) {
      if (orig != 0)
        *--p = '0';
    }
    if (base == 16) {
      *--p = 'x';
      *--p = '0';
    }
  }

  // --------------------------------------------------------------------------
  // [Width]
  // --------------------------------------------------------------------------

  if (sign != 0)
    *--p = sign;

  if (width > 256)
    width = 256;

  if (width <= numberLength)
    width = 0;
  else
    width -= numberLength;

  // --------------------------------------------------------------------------
  // Write]
  // --------------------------------------------------------------------------

  size_t prefixLength = (size_t)(buf + ASMJIT_ARRAY_SIZE(buf) - p) - numberLength;
  char* data = prepare(op, prefixLength + width + numberLength);

  if (!data)
    return DebugUtils::errored(kErrorNoHeapMemory);

  ::memcpy(data, p, prefixLength);
  data += prefixLength;

  ::memset(data, '0', width);
  data += width;

  ::memcpy(data, p + prefixLength, numberLength);
  return kErrorOk;
}